

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O2

CaseDefinition *
vkt::tessellation::anon_unknown_2::makeCaseDefinition
          (CaseDefinition *__return_storage_ptr__,TessPrimitiveType primitiveType,
          SpacingMode spacingMode,string *referenceImagePathPrefix)

{
  (__return_storage_ptr__->referenceImagePathPrefix)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->referenceImagePathPrefix).field_2;
  (__return_storage_ptr__->referenceImagePathPrefix)._M_string_length = 0;
  (__return_storage_ptr__->referenceImagePathPrefix).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->primitiveType = primitiveType;
  __return_storage_ptr__->spacingMode = spacingMode;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->referenceImagePathPrefix);
  return __return_storage_ptr__;
}

Assistant:

inline CaseDefinition makeCaseDefinition (const TessPrimitiveType	primitiveType,
										  const SpacingMode			spacingMode,
										  const std::string&		referenceImagePathPrefix)
{
	CaseDefinition caseDef;
	caseDef.primitiveType = primitiveType;
	caseDef.spacingMode = spacingMode;
	caseDef.referenceImagePathPrefix = referenceImagePathPrefix;
	return caseDef;
}